

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finalize.hpp
# Opt level: O2

void boost::runtime::finalize_arguments(parameters_store *params,arguments_store *args)

{
  bool bVar1;
  type pbVar2;
  type pbVar3;
  _Base_ptr p_Var4;
  basic_param_ptr param;
  shared_ptr<boost::runtime::basic_param> local_168;
  _Rb_tree_node_base *local_158;
  basic_cstring<const_char> local_150;
  cstring local_140;
  cstring local_130;
  cstring local_120;
  undefined **local_110;
  pointer local_108;
  pointer local_100;
  _Alloc_hider local_f8;
  size_type local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  missing_req_arg local_d8;
  specific_param_error<boost::runtime::missing_req_arg,_boost::runtime::input_error> local_a0;
  missing_req_arg local_68;
  
  local_158 = &(params->m_parameters)._M_t._M_impl.super__Rb_tree_header._M_header;
  bVar1 = true;
  for (p_Var4 = (params->m_parameters)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (bVar1 && (p_Var4 != local_158)); p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    bVar1 = false;
    while (!bVar1) {
      local_168.px = (element_type *)p_Var4[1]._M_left;
      local_168.pn.pi_ = (sp_counted_base *)p_Var4[1]._M_right;
      if ((_Base_ptr)local_168.pn.pi_ != (_Base_ptr)0x0) {
        LOCK();
        *(int *)&((_Base_ptr)local_168.pn.pi_)->_M_parent =
             *(int *)&((_Base_ptr)local_168.pn.pi_)->_M_parent + 1;
        UNLOCK();
      }
      pbVar2 = shared_ptr<boost::runtime::basic_param>::operator->(&local_168);
      local_120.m_begin = (pbVar2->p_name)._M_dataplus._M_p;
      local_120.m_end = local_120.m_begin + (pbVar2->p_name)._M_string_length;
      bVar1 = arguments_store::has(args,&local_120);
      if (!bVar1) {
        pbVar2 = shared_ptr<boost::runtime::basic_param>::operator->(&local_168);
        if ((pbVar2->p_has_default_value).super_class_property<bool>.value == true) {
          pbVar2 = shared_ptr<boost::runtime::basic_param>::operator->(&local_168);
          (*pbVar2->_vptr_basic_param[4])(pbVar2,args);
        }
        pbVar2 = shared_ptr<boost::runtime::basic_param>::operator->(&local_168);
        local_130.m_begin = (pbVar2->p_name)._M_dataplus._M_p;
        local_130.m_end = local_130.m_begin + (pbVar2->p_name)._M_string_length;
        bVar1 = arguments_store::has(args,&local_130);
        if (!bVar1) {
          pbVar2 = shared_ptr<boost::runtime::basic_param>::operator->(&local_168);
          if (pbVar2->p_optional == false) {
            pbVar2 = shared_ptr<boost::runtime::basic_param>::operator->(&local_168);
            local_108 = (pbVar2->p_name)._M_dataplus._M_p;
            local_100 = local_108 + (pbVar2->p_name)._M_string_length;
            local_f8._M_p = (pointer)&local_e8;
            local_f0 = 0;
            local_e8._M_local_buf[0] = '\0';
            local_110 = &PTR__param_error_001e1f08;
            specific_param_error<boost::runtime::missing_req_arg,_boost::runtime::input_error>::
            operator<<(&local_d8,
                       (specific_param_error<boost::runtime::missing_req_arg,_boost::runtime::input_error>
                        *)&local_110,"Missing argument for required parameter ");
            pbVar2 = shared_ptr<boost::runtime::basic_param>::operator->(&local_168);
            specific_param_error<boost::runtime::missing_req_arg,boost::runtime::input_error>::
            operator<<((missing_req_arg *)&local_a0,
                       (specific_param_error<boost::runtime::missing_req_arg,boost::runtime::input_error>
                        *)&local_d8,&pbVar2->p_name);
            specific_param_error<boost::runtime::missing_req_arg,_boost::runtime::input_error>::
            operator<<(&local_68,&local_a0,".");
            unit_test::ut_detail::throw_exception<boost::runtime::missing_req_arg>(&local_68);
          }
        }
      }
      pbVar2 = shared_ptr<boost::runtime::basic_param>::operator->(&local_168);
      local_140.m_begin = (pbVar2->p_name)._M_dataplus._M_p;
      local_140.m_end = local_140.m_begin + (pbVar2->p_name)._M_string_length;
      bVar1 = arguments_store::has(args,&local_140);
      if (bVar1) {
        pbVar2 = shared_ptr<boost::runtime::basic_param>::operator->(&local_168);
        if ((pbVar2->p_callback).super_function1<void,_boost::unit_test::basic_cstring<const_char>_>
            .super_function_base.vtable != (vtable_base *)0x0) {
          pbVar2 = shared_ptr<boost::runtime::basic_param>::operator->(&local_168);
          pbVar3 = shared_ptr<boost::runtime::basic_param>::operator->(&local_168);
          local_150.m_begin = (pbVar3->p_name)._M_dataplus._M_p;
          local_150.m_end = local_150.m_begin + (pbVar3->p_name)._M_string_length;
          function1<void,_boost::unit_test::basic_cstring<const_char>_>::operator()
                    (&(pbVar2->p_callback).
                      super_function1<void,_boost::unit_test::basic_cstring<const_char>_>,&local_150
                    );
        }
      }
      detail::shared_count::~shared_count(&local_168.pn);
      bVar1 = true;
    }
  }
  return;
}

Assistant:

inline void
finalize_arguments( parameters_store const& params, runtime::arguments_store& args )
{
    BOOST_TEST_FOREACH( parameters_store::storage_type::value_type const&, v, params.all() ) {
        basic_param_ptr param = v.second;

        if( !args.has( param->p_name ) ) {
            if( param->p_has_default_value )
                param->produce_default( args );

            if( !args.has( param->p_name ) ) {
                BOOST_TEST_I_ASSRT( param->p_optional,
                    missing_req_arg( param->p_name ) << "Missing argument for required parameter " << param->p_name << "." );
            }
        }

        if( args.has( param->p_name ) && !!param->p_callback )
            param->p_callback( param->p_name );
    }
}